

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

void __thiscall re2::BitState::~BitState(BitState *this)

{
  if (this->visited_ != (uint32 *)0x0) {
    operator_delete__(this->visited_);
  }
  if (this->job_ != (Job *)0x0) {
    operator_delete__(this->job_);
  }
  if (this->cap_ != (char **)0x0) {
    operator_delete__(this->cap_);
    return;
  }
  return;
}

Assistant:

BitState::~BitState() {
  delete[] visited_;
  delete[] job_;
  delete[] cap_;
}